

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

void __thiscall ON_RenderChannels::SetMode(ON_RenderChannels *this,Modes m)

{
  ON_InternalXMLImpl *this_00;
  wchar_t *path_to_node;
  ON_XMLVariant local_128;
  ON_wString local_20;
  ON_wString s;
  Modes m_local;
  ON_RenderChannels *this_local;
  
  s.m_s._4_4_ = m;
  ON_wString::ON_wString(&local_20,L"automatic");
  if (s.m_s._4_4_ == Custom) {
    ON_wString::operator=(&local_20,L"custom");
  }
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_128,&local_20);
  ON_InternalXMLImpl::SetParameter(this_00,path_to_node,L"mode",&local_128);
  ::ON_XMLVariant::~ON_XMLVariant(&local_128);
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_RenderChannels::SetMode(Modes m)
{
  ON_wString s = ON_RDK_RCH_MODE_AUTOMATIC;
  if (Modes::Custom == m)
    s = ON_RDK_RCH_MODE_CUSTOM;

  m_impl->SetParameter(XMLPath(), ON_RDK_RCH_MODE, s);
}